

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

BBox * __thiscall CMU462::DynamicScene::Scene::get_bbox(BBox *__return_storage_ptr__,Scene *this)

{
  _Rb_tree_node_base *p_Var1;
  BBox BStack_68;
  
  *(undefined4 *)&(__return_storage_ptr__->max).x = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->max).x + 4) = 0xfff00000;
  *(undefined4 *)&(__return_storage_ptr__->max).y = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->max).y + 4) = 0xfff00000;
  (__return_storage_ptr__->max).z = -INFINITY;
  (__return_storage_ptr__->min).x = INFINITY;
  (__return_storage_ptr__->min).y = INFINITY;
  (__return_storage_ptr__->min).z = INFINITY;
  *(undefined4 *)&(__return_storage_ptr__->extent).x = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->extent).x + 4) = 0xfff00000;
  *(undefined4 *)&(__return_storage_ptr__->extent).y = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->extent).y + 4) = 0xfff00000;
  (__return_storage_ptr__->extent).z = -INFINITY;
  for (p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0x20))(&BStack_68);
    BBox::expand(__return_storage_ptr__,&BStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Scene::get_bbox() {
  BBox bbox;
  for (SceneObject *obj : objects) {
    bbox.expand(obj->get_bbox());
  }
  return bbox;
}